

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

wchar_t scan_items(object **item_list,size_t item_max,player *p,wchar_t mode,item_tester tester)

{
  ushort uVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object **items;
  object *poVar4;
  ulong local_50;
  size_t item_num;
  wchar_t i;
  wchar_t floor_num;
  object **floor_list;
  wchar_t floor_max;
  _Bool use_floor;
  _Bool use_quiver;
  _Bool use_equip;
  _Bool use_inven;
  item_tester tester_local;
  wchar_t mode_local;
  player *p_local;
  size_t item_max_local;
  object **item_list_local;
  
  uVar1 = z_info->floor_size;
  items = (object **)mem_zalloc((long)(int)(uint)uVar1 << 3);
  local_50 = 0;
  if ((mode & 2U) != 0) {
    for (item_num._0_4_ = 0; (wchar_t)item_num < (int)(uint)z_info->pack_size && local_50 < item_max
        ; item_num._0_4_ = (wchar_t)item_num + 1) {
      _Var2 = object_test(tester,p->upkeep->inven[(wchar_t)item_num]);
      if (_Var2) {
        item_list[local_50] = p->upkeep->inven[(wchar_t)item_num];
        local_50 = local_50 + 1;
      }
    }
  }
  if ((mode & 1U) != 0) {
    for (item_num._0_4_ = L'\0';
        (wchar_t)item_num < (int)(uint)(p->body).count && local_50 < item_max;
        item_num._0_4_ = (wchar_t)item_num + L'\x01') {
      poVar4 = slot_object(p,(wchar_t)item_num);
      _Var2 = object_test(tester,poVar4);
      if (_Var2) {
        poVar4 = slot_object(p,(wchar_t)item_num);
        item_list[local_50] = poVar4;
        local_50 = local_50 + 1;
      }
    }
  }
  if ((mode & 8U) != 0) {
    for (item_num._0_4_ = 0;
        (wchar_t)item_num < (int)(uint)z_info->quiver_size && local_50 < item_max;
        item_num._0_4_ = (wchar_t)item_num + 1) {
      _Var2 = object_test(tester,p->upkeep->quiver[(wchar_t)item_num]);
      if (_Var2) {
        item_list[local_50] = p->upkeep->quiver[(wchar_t)item_num];
        local_50 = local_50 + 1;
      }
    }
  }
  if ((mode & 4U) != 0) {
    wVar3 = scan_floor(items,(uint)uVar1,p,OFLOOR_VISIBLE|OFLOOR_SENSE|OFLOOR_TEST,tester);
    for (item_num._0_4_ = L'\0'; (wchar_t)item_num < wVar3 && local_50 < item_max;
        item_num._0_4_ = (wchar_t)item_num + L'\x01') {
      item_list[local_50] = items[(wchar_t)item_num];
      local_50 = local_50 + 1;
    }
  }
  mem_free(items);
  return (wchar_t)local_50;
}

Assistant:

int scan_items(struct object **item_list, size_t item_max, struct player *p,
		int mode, item_tester tester)
{
	bool use_inven = ((mode & USE_INVEN) ? true : false);
	bool use_equip = ((mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((mode & USE_QUIVER) ? true : false);
	bool use_floor = ((mode & USE_FLOOR) ? true : false);

	int floor_max = z_info->floor_size;
	struct object **floor_list = mem_zalloc(floor_max * sizeof(struct object *));
	int floor_num;

	int i;
	size_t item_num = 0;

	if (use_inven)
		for (i = 0; i < z_info->pack_size && item_num < item_max; i++) {
			if (object_test(tester, p->upkeep->inven[i]))
				item_list[item_num++] = p->upkeep->inven[i];
		}

	if (use_equip)
		for (i = 0; i < p->body.count && item_num < item_max; i++) {
			if (object_test(tester, slot_object(p, i)))
				item_list[item_num++] = slot_object(p, i);
		}

	if (use_quiver)
		for (i = 0; i < z_info->quiver_size && item_num < item_max; i++) {
			if (object_test(tester, p->upkeep->quiver[i]))
				item_list[item_num++] = p->upkeep->quiver[i];
		}

	/* Scan all non-gold objects in the grid */
	if (use_floor) {
		floor_num = scan_floor(floor_list, floor_max, p,
			OFLOOR_TEST | OFLOOR_SENSE | OFLOOR_VISIBLE, tester);

		for (i = 0; i < floor_num && item_num < item_max; i++)
			item_list[item_num++] = floor_list[i];
	}

	mem_free(floor_list);
	return item_num;
}